

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
               *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 extraout_var_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = this->_has_bits_[0];
  if ((uVar1 & 1) == 0) {
    lVar6 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    sVar3 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar2));
    lVar6 = (long)(int)sVar3 + 1;
    uVar1 = this->_has_bits_[0];
  }
  if ((uVar1 & 2) == 0) {
    lVar5 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    uVar4 = *(ulong *)CONCAT44(extraout_var_00,iVar2) | 1;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    lVar5 = (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 1;
  }
  return lVar5 + lVar6;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }